

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O1

FunctionCodeGenJitTimeData *
Js::FunctionCodeGenJitTimeData::New
          (Recycler *recycler,FunctionInfo *functionInfo,EntryPointInfo *entryPoint,bool isInlined)

{
  FunctionBody *this;
  code *pcVar1;
  undefined1 *puVar2;
  bool bVar3;
  uint16 profiledIterations;
  undefined4 *puVar4;
  ByteBlock *pBVar5;
  ScriptContext *pSVar6;
  Var globalThis;
  Recycler *alloc;
  FunctionCodeGenJitTimeData *this_00;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  this = (FunctionBody *)(functionInfo->functionBodyImpl).ptr;
  data._32_8_ = entryPoint;
  if (this != (FunctionBody *)0x0) {
    bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
    if (bVar3) {
      bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      pBVar5 = FunctionBody::GetByteCode(this);
      if (pBVar5 == (ByteBlock *)0x0) {
        profiledIterations = 0;
        globalThis = (Var)0x0;
      }
      else {
        pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
        globalThis = GlobalObject::ToThis
                               ((((pSVar6->super_ScriptContextBase).javascriptLibrary)->
                                super_JavascriptLibraryBase).globalObject.ptr);
        profiledIterations = FunctionBody::GetProfiledIterations(this);
      }
      puVar2 = &(this->counters).field_0x1;
      *puVar2 = *puVar2 | 1;
      goto LAB_00439aea;
    }
  }
  profiledIterations = 0;
  globalThis = (Var)0x0;
LAB_00439aea:
  local_68 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_d5dfd3;
  data.filename._0_4_ = 0x30;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
  this_00 = (FunctionCodeGenJitTimeData *)new<Memory::Recycler>(0xb0,alloc,0x38bbb2);
  FunctionCodeGenJitTimeData
            (this_00,functionInfo,(EntryPointInfo *)data._32_8_,globalThis,profiledIterations,
             isInlined);
  return this_00;
}

Assistant:

FunctionCodeGenJitTimeData* FunctionCodeGenJitTimeData::New(Recycler* recycler, FunctionInfo *const functionInfo, EntryPointInfo *const entryPoint, bool isInlined)
    {
        Var globalThis = nullptr;
        uint16 profiledIterations = 0;
        FunctionProxy *proxy = functionInfo->GetFunctionProxy();
        if (proxy && proxy->IsFunctionBody())
        {
            FunctionBody* functionBody = proxy->GetFunctionBody();
            if (functionBody)
            {
                if (functionBody->GetByteCode())
                {
                    globalThis = functionBody->GetScriptContext()->GetLibrary()->GetGlobalObject()->ToThis();
                    profiledIterations = functionBody->GetProfiledIterations();
                }

                DebugOnly(functionBody->LockDownCounters());
            }
        }

        return RecyclerNew(recycler, FunctionCodeGenJitTimeData, functionInfo, entryPoint, globalThis, profiledIterations, isInlined);
    }